

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O3

void __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
::ConvertRange(RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
               *this,ItemType *item,int i)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  pointer pNVar4;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  undefined8 uVar5;
  ptr ppVar6;
  long lVar7;
  long lVar8;
  NodeRange NVar9;
  NodeRange NVar10;
  array<int,_3UL> be;
  AlgConEQ lceq;
  QuadAndLinTerms body;
  int local_764;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_760;
  QuadAndLinTerms local_580;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_3c8;
  inline_storage<double,_6U> *local_1e8;
  ulong local_1e0;
  long local_1d8;
  inline_storage<double,_6U> local_1d0;
  inline_storage<int,_6U> *local_1a0;
  ulong local_198;
  long local_190;
  inline_storage<int,_6U> local_188;
  QuadTerms local_170;
  
  pFVar3 = (this->
           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ).mdl_cvt_;
  (pFVar3->
  super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ).
  super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_.pvn_ = (ValueNode *)0x0;
  (pFVar3->
  super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ).
  super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_.ir_.beg_ = 0;
  (pFVar3->
  super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ).
  super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_.ir_.end_ = 0;
  pNVar4 = (pFVar3->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .auto_link_targ_items_.
           super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pFVar3->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .auto_link_targ_items_.
               super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
               super__Vector_impl_data + 8) != pNVar4) {
    *(pointer *)
     ((long)&(pFVar3->
             super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ).
             super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             .auto_link_targ_items_.
             super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
             super__Vector_impl_data + 8) = pNVar4;
  }
  NVar9 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AddVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)(this->
                      super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      ).mdl_cvt_,0.0,(item->super_AlgConRange).ub_ - (item->super_AlgConRange).lb_,
                   CONTINUOUS);
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)&local_1e8,&item->super_QuadAndLinTerms
            );
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_1a0,
             &(item->super_QuadAndLinTerms).super_LinTerms.vars_);
  QuadTerms::QuadTerms(&local_170,&(item->super_QuadAndLinTerms).super_QuadTerms);
  local_3c8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_764 = NVar9.ir_.beg_;
  gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
            ((small_vector_base<std::allocator<double>,6u> *)&local_1e8,(double *)&local_3c8);
  gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
            ((small_vector_base<std::allocator<int>,6u> *)&local_1a0,&local_764);
  if (local_1e0 < 7) {
    local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.m_storage;
    local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_1d8 != 0) {
      memcpy(local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
             m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_1e8,
             local_1d8 * 8);
    }
  }
  else {
    local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_1e8;
    local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_1e0;
    local_1e0 = 6;
    local_1d8 = 0;
    local_1e8 = &local_1d0;
  }
  if (local_198 < 7) {
    local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.m_storage;
    local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_190 != 0) {
      memcpy(local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,local_1a0,local_190 * 4);
    }
  }
  else {
    local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_1a0;
    local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_198;
    local_198 = 6;
    local_190 = 0;
    local_1a0 = &local_188;
  }
  ppVar6 = local_170.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  if (local_170.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity < 9) {
    local_580.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)&local_580.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.m_storage;
    local_580.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    if (local_170.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
        != 0) {
      lVar7 = local_170.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_size << 4;
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ppVar6->first + lVar8);
        uVar5 = puVar1[1];
        *(undefined8 *)
         ((long)&(local_580.super_QuadTerms.folded_.
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_data_ptr)->first + lVar8) = *puVar1;
        *(undefined8 *)
         ((long)&local_580.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.m_storage + lVar8 + 8U) = uVar5;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar8);
    }
  }
  else {
    local_580.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = local_170.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
    local_580.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = local_170.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_capacity;
    local_170.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    local_170.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    local_170.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)&local_170.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.m_storage;
  }
  if (local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_580.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_580.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    local_580.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_580.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_580.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_580.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               m_storage;
  }
  if (local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>
               .m_data.m_storage;
    local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
             m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               m_storage;
  }
  if (local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>
               .m_data.m_storage;
    local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
             m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               m_storage;
  }
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (&local_3c8,&local_580,(AlgConRhs<0>)(item->super_AlgConRange).ub_,true);
  if (6 < local_580.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_580.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_580.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_580.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_580.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_580.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_580.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_580.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_580.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_580.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_580.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_580.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_580.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_580.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_580.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_580.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  local_760.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&local_760.super_BasicConstraint.name_.field_2;
  paVar2 = &local_3c8.super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) {
    local_760.super_BasicConstraint.name_.field_2._8_8_ =
         local_3c8.super_BasicConstraint.name_.field_2._8_8_;
  }
  else {
    local_760.super_BasicConstraint.name_._M_dataplus._M_p =
         local_3c8.super_BasicConstraint.name_._M_dataplus._M_p;
  }
  local_760.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ =
       local_3c8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
  local_760.super_BasicConstraint.name_.field_2._M_local_buf[0] =
       local_3c8.super_BasicConstraint.name_.field_2._M_local_buf[0];
  local_760.super_BasicConstraint.name_._M_string_length =
       local_3c8.super_BasicConstraint.name_._M_string_length;
  local_3c8.super_BasicConstraint.name_._M_string_length = 0;
  local_3c8.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_3c8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
  if (local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
  }
  if (local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
  }
  ppVar6 = local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity < 9) {
    local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)((long)&local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
        != 0) {
      lVar7 = local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_size << 4;
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ppVar6->first + lVar8);
        uVar5 = puVar1[1];
        *(undefined8 *)
         ((long)&(local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_data_ptr)->first + lVar8) = *puVar1;
        *(undefined8 *)
         ((long)&local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data + lVar8 + 0x20) = uVar5;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar8);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
    local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_capacity;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data + 0x18);
  }
  if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
  }
  if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
  }
  if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
  }
  local_760.super_AlgConRhs<0>.rhs_ = local_3c8.super_AlgConRhs<0>.rhs_;
  NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                     ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)this_00,&local_760);
  NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::AutoLink(this_00,NVar10);
  if (6 < local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_760.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_760.super_BasicConstraint.name_.field_2) {
    operator_delete(local_760.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_760.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  be._M_elems._0_8_ = (ulong)(uint)i | (long)NVar10.ir_ << 0x20;
  be._M_elems[2] = NVar9.ir_.beg_;
  pre::
  BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  ::AddEntry((BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
              *)&this->link_rng2slk_,be);
  if (6 < local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_3c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c8.super_BasicConstraint.name_._M_dataplus._M_p,
                    CONCAT71(local_3c8.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                             _1_7_,local_3c8.super_BasicConstraint.name_.field_2._M_local_buf[0]) +
                    1);
  }
  if (6 < local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_170.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_170.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_170.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_198) {
    operator_delete(local_1a0,local_198 << 2);
  }
  if (6 < local_1e0) {
    operator_delete(local_1e8,local_1e0 << 3);
  }
  return;
}

Assistant:

void ConvertRange(const ItemType& item, int i) {
    GetMC().TurnOffAutoLinking();     // for range only
    auto slk = int( GetMC().AddVar(0.0, item.ub()-item.lb()) );
    auto body = item.GetBody();
    body.add_term(1.0, slk);
    AlgConEQ lceq { std::move(body), item.ub() };
    int i1 = (int)GetMC().AddConstraint(std::move(lceq));
    GetSlackLink().AddEntry({i, i1, slk});
  }